

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# densehashtable.h
# Opt level: O3

void __thiscall
google::
dense_hashtable<std::pair<int,int>,std::pair<int,int>,TransparentHasher,PairNegation<std::pair<int,int>>,SetKey<std::pair<int,int>,PairNegation<std::pair<int,int>>>,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>
::
copy_or_move_from<google::dense_hashtable<std::pair<int,int>,std::pair<int,int>,TransparentHasher,PairNegation<std::pair<int,int>>,SetKey<std::pair<int,int>,PairNegation<std::pair<int,int>>>,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>>
          (dense_hashtable<std::pair<int,int>,std::pair<int,int>,TransparentHasher,PairNegation<std::pair<int,int>>,SetKey<std::pair<int,int>,PairNegation<std::pair<int,int>>>,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>
           *this,dense_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                 *ht,size_type min_buckets_wanted)

{
  long lVar1;
  size_type new_num_buckets;
  ulong uVar2;
  int iVar3;
  long lVar4;
  iterator __begin0;
  iterator __end0;
  dense_hashtable_iterator<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  local_50;
  dense_hashtable_iterator<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  local_38;
  
  new_num_buckets =
       sparsehash_internal::
       sh_hashtable_settings<std::pair<int,_int>,_TransparentHasher,_unsigned_long,_4>::min_buckets
                 ((sh_hashtable_settings<std::pair<int,_int>,_TransparentHasher,_unsigned_long,_4> *
                  )this,ht->num_elements - ht->num_deleted,min_buckets_wanted);
  dense_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::clear_to_size((dense_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                   *)this,new_num_buckets);
  local_50.pos = ht->table;
  local_50.end = local_50.pos + ht->num_buckets;
  local_50.ht = ht;
  dense_hashtable_iterator<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::advance_past_empty_and_deleted(&local_50);
  local_38.pos = ht->table + ht->num_buckets;
  local_38.ht = ht;
  local_38.end = local_38.pos;
  dense_hashtable_iterator<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::advance_past_empty_and_deleted(&local_38);
  if (local_50.pos != local_38.pos) {
    do {
      iVar3 = (local_50.pos)->first;
      *(int *)(this + 4) = *(int *)(this + 4) + 1;
      lVar1 = *(long *)(this + 0x78);
      uVar2 = -(long)iVar3 & *(long *)(this + 0x60) - 1U;
      if (*(int *)(lVar1 + uVar2 * 8) + *(int *)(this + 0x44) == 0) {
        iVar3 = *(int *)(this + 0x38) + 1;
      }
      else {
        lVar4 = 1;
        do {
          uVar2 = uVar2 + lVar4 & *(long *)(this + 0x60) - 1U;
          lVar4 = lVar4 + 1;
        } while (*(int *)(lVar1 + uVar2 * 8) + *(int *)(this + 0x44) != 0);
        iVar3 = *(int *)(this + 0x38) + (int)lVar4;
      }
      *(int *)(this + 0x38) = iVar3;
      *(pair<int,_int> *)(lVar1 + uVar2 * 8) = *local_50.pos;
      *(long *)(this + 0x58) = *(long *)(this + 0x58) + 1;
      local_50.pos = local_50.pos + 1;
      dense_hashtable_iterator<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
      ::advance_past_empty_and_deleted(&local_50);
    } while (local_50.pos != local_38.pos);
  }
  *(int *)(this + 0x2c) = *(int *)(this + 0x2c) + 1;
  return;
}

Assistant:

void copy_or_move_from(Hashtable&& ht, size_type min_buckets_wanted) {
    clear_to_size(settings.min_buckets(ht.size(), min_buckets_wanted));

    // We use a normal iterator to get non-deleted bcks from ht
    // We could use insert() here, but since we know there are
    // no duplicates and no deleted items, we can be more efficient
    assert((bucket_count() & (bucket_count() - 1)) == 0);  // a power of two
    for (auto&& value : ht) {
      size_type num_probes = 0;  // how many times we've probed
      size_type bucknum;
      const size_type bucket_count_minus_one = bucket_count() - 1;
      for (bucknum = hash(get_key(value)) & bucket_count_minus_one;
           !test_empty(bucknum);  // not empty
           bucknum =
               (bucknum + JUMP_(key, num_probes)) & bucket_count_minus_one) {
        ++num_probes;
        assert(num_probes < bucket_count() &&
               "Hashtable is full: an error in key_equal<> or hash<>");
      }

      using will_move = std::is_rvalue_reference<Hashtable&&>;
      using value_t = typename std::conditional<will_move::value, value_type&&, const_reference>::type;

      set_value(&table[bucknum], std::forward<value_t>(value));
      num_elements++;
    }
    settings.inc_num_ht_copies();
  }